

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

string * __thiscall
yy::mylanguage_parser::yytnamerr__abi_cxx11_
          (string *__return_storage_ptr__,mylanguage_parser *this,char *yystr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  bool bVar4;
  mylanguage_parser *pmVar5;
  mylanguage_parser *pmVar6;
  size_t sVar7;
  string *yyr;
  
  if (*(char *)&this->_vptr_mylanguage_parser != '\"') {
LAB_00109d75:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar7 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,(long)&this->_vptr_mylanguage_parser + sVar7);
    return __return_storage_ptr__;
  }
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = false;
  pmVar6 = this;
LAB_00109d0e:
  pmVar5 = (mylanguage_parser *)((long)&pmVar6->_vptr_mylanguage_parser + 1);
  bVar2 = *(byte *)((long)&pmVar6->_vptr_mylanguage_parser + 1);
  if (bVar2 < 0x5c) {
    if (bVar2 == 0x22) {
      bVar4 = true;
LAB_00109d58:
      if (bVar4) {
        return __return_storage_ptr__;
      }
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      goto LAB_00109d75;
    }
    if ((bVar2 == 0x27) || (bVar2 == 0x2c)) goto LAB_00109d58;
  }
  else if (bVar2 == 0x5c) {
    if (*(char *)((long)&pmVar6->_vptr_mylanguage_parser + 2) != '\\') {
      bVar4 = false;
      goto LAB_00109d58;
    }
    pmVar5 = (mylanguage_parser *)((long)&pmVar6->_vptr_mylanguage_parser + 2);
  }
  pmVar6 = pmVar5;
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  goto LAB_00109d0e;
}

Assistant:

std::string
  mylanguage_parser::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }